

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifyFEND.hpp
# Opt level: O3

void njoy::ENDFtk::file::Base<njoy::ENDFtk::file::Type<34>,_njoy::ENDFtk::section::Type<34>_>::
     verifyFEND(StructureDivision *structureDivision,long lineNumber)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  undefined8 *puVar4;
  char *args;
  
  bVar3 = StructureDivision::isSendPermissive(structureDivision);
  if (((bVar3) && ((structureDivision->tail).fields._M_elems[1] == 0)) &&
     (0 < (structureDivision->tail).fields._M_elems[0])) {
    return;
  }
  bVar3 = StructureDivision::isSendPermissive(structureDivision);
  iVar1 = (structureDivision->tail).fields._M_elems[0];
  iVar2 = (structureDivision->tail).fields._M_elems[1];
  if (0 < iVar1 && (iVar2 != 0 && bVar3)) {
    args = "Encountered duplicate SEND record in File {}";
  }
  else {
    if (iVar1 != 0 && ((structureDivision->tail).fields._M_elems[2] != 0 && iVar2 != 0)) {
      tools::Log::error<char_const*,int>("Inappropriate section encountered in File {}",0x22);
      tools::Log::info<char_const*,int>
                ("Section number: {}",(structureDivision->tail).fields._M_elems[2]);
      goto LAB_001811d0;
    }
    bVar3 = StructureDivision::isSendPermissive(structureDivision);
    if (((bVar3) && ((structureDivision->tail).fields._M_elems[1] == 0)) &&
       ((structureDivision->tail).fields._M_elems[0] == 0)) {
      args = "Encountered MEND record before FEND record in File {}";
    }
    else {
      bVar3 = StructureDivision::isSendPermissive(structureDivision);
      if (!bVar3) {
        return;
      }
      if ((structureDivision->tail).fields._M_elems[1] != 0) {
        return;
      }
      if ((structureDivision->tail).fields._M_elems[0] != -1) {
        return;
      }
      args = "Encountered TEND record before FEND record in File {}";
    }
  }
  tools::Log::error<char_const*,int>(args,0x22);
LAB_001811d0:
  tools::Log::info<char_const*,long>("Line number: {}",lineNumber);
  puVar4 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar4 = getenv;
  __cxa_throw(puVar4,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static void
verifyFEND( const StructureDivision& structureDivision,
            long lineNumber ) {

  if ( not structureDivision.isFend() ) {

    int MF = Base::MF();
    if ( structureDivision.isSend() ) {

      Log::error( "Encountered duplicate SEND record in File {}", MF );
      Log::info("Line number: {}", lineNumber );
      throw std::exception{};
    }
    else if ( structureDivision.isHead() ) {

      Log::error( "Inappropriate section encountered in File {}", MF );
      Log::info( "Section number: {}", asHead( structureDivision ).section() );
      Log::info( "Line number: {}", lineNumber );
      throw std::exception{};
    }
    else if ( structureDivision.isMend() ) {

      Log::error( "Encountered MEND record before FEND record in File {}", MF );
      Log::info( "Line number: {}", lineNumber );
      throw std::exception{};
    }
    else if ( structureDivision.isTend() ) {

      Log::error( "Encountered TEND record before FEND record in File {}", MF );
      Log::info( "Line number: {}", lineNumber );
      throw std::exception{};
    }
  }
}